

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O0

CONNECTION_HANDLE
connection_create2(XIO_HANDLE xio,char *hostname,char *container_id,ON_NEW_ENDPOINT on_new_endpoint,
                  void *callback_context,ON_CONNECTION_STATE_CHANGED on_connection_state_changed,
                  void *on_connection_state_changed_context,ON_IO_ERROR on_io_error,
                  void *on_io_error_context)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  FRAME_CODEC_HANDLE pFVar3;
  AMQP_FRAME_CODEC_HANDLE pAVar4;
  size_t sVar5;
  void *pvVar6;
  TICK_COUNTER_HANDLE pTVar7;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  size_t container_id_length;
  LOGGER_LOG l_4;
  size_t hostname_length;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  CONNECTION_HANDLE connection;
  ON_CONNECTION_STATE_CHANGED on_connection_state_changed_local;
  void *callback_context_local;
  ON_NEW_ENDPOINT on_new_endpoint_local;
  char *container_id_local;
  char *hostname_local;
  XIO_HANDLE xio_local;
  
  if ((xio == (XIO_HANDLE)0x0) || (container_id == (char *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                ,"connection_create2",0x477,1,"Bad arguments: xio = %p, container_id = %p",xio,
                container_id);
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    l = (LOGGER_LOG)calloc(1,0xe8);
    if (l == (LOGGER_LOG)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                  ,"connection_create2",0x480,1,"Cannot allocate memory for connection");
      }
    }
    else {
      *(XIO_HANDLE *)l = xio;
      pFVar3 = frame_codec_create(frame_codec_error,l);
      *(FRAME_CODEC_HANDLE *)(l + 0x18) = pFVar3;
      if (*(long *)(l + 0x18) == 0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                    ,"connection_create2",0x48b,1,"Cannot create frame_codec");
        }
        free(l);
        l = (LOGGER_LOG)0x0;
      }
      else {
        pAVar4 = amqp_frame_codec_create
                           (*(FRAME_CODEC_HANDLE *)(l + 0x18),on_amqp_frame_received,
                            on_empty_amqp_frame_received,amqp_frame_codec_error,l);
        *(AMQP_FRAME_CODEC_HANDLE *)(l + 0x20) = pAVar4;
        if (*(long *)(l + 0x20) == 0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                      ,"connection_create2",0x495,1,"Cannot create amqp_frame_codec");
          }
          frame_codec_destroy(*(FRAME_CODEC_HANDLE *)(l + 0x18));
          free(l);
          l = (LOGGER_LOG)0x0;
        }
        else {
          if (hostname == (char *)0x0) {
            *(undefined8 *)(l + 0x38) = 0;
          }
          else {
            sVar5 = strlen(hostname);
            pvVar6 = malloc(sVar5 + 1);
            *(void **)(l + 0x38) = pvVar6;
            if (*(long *)(l + 0x38) == 0) {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                          ,"connection_create2",0x4a3,1,"Cannot allocate memory for host name");
              }
              amqp_frame_codec_destroy(*(AMQP_FRAME_CODEC_HANDLE *)(l + 0x20));
              frame_codec_destroy(*(FRAME_CODEC_HANDLE *)(l + 0x18));
              free(l);
              l = (LOGGER_LOG)0x0;
            }
            else {
              memcpy(*(void **)(l + 0x38),hostname,sVar5 + 1);
            }
          }
          if (l != (LOGGER_LOG)0x0) {
            sVar5 = strlen(container_id);
            pvVar6 = malloc(sVar5 + 1);
            *(void **)(l + 0x40) = pvVar6;
            if (*(long *)(l + 0x40) == 0) {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                          ,"connection_create2",0x4ba,1,"Cannot allocate memory for container_id");
              }
              free(*(void **)(l + 0x38));
              amqp_frame_codec_destroy(*(AMQP_FRAME_CODEC_HANDLE *)(l + 0x20));
              frame_codec_destroy(*(FRAME_CODEC_HANDLE *)(l + 0x18));
              free(l);
              l = (LOGGER_LOG)0x0;
            }
            else {
              pTVar7 = tickcounter_create();
              *(TICK_COUNTER_HANDLE *)(l + 0x48) = pTVar7;
              if (*(long *)(l + 0x48) == 0) {
                p_Var2 = xlogging_get_log_function();
                if (p_Var2 != (LOGGER_LOG)0x0) {
                  (*p_Var2)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                            ,"connection_create2",0x4c6,1,"Cannot create tick counter");
                }
                free(*(void **)(l + 0x40));
                free(*(void **)(l + 0x38));
                amqp_frame_codec_destroy(*(AMQP_FRAME_CODEC_HANDLE *)(l + 0x20));
                frame_codec_destroy(*(FRAME_CODEC_HANDLE *)(l + 0x18));
                free(l);
                l = (LOGGER_LOG)0x0;
              }
              else {
                memcpy(*(void **)(l + 0x40),container_id,sVar5 + 1);
                *(undefined4 *)(l + 0xa8) = 0xffffffff;
                *(undefined2 *)(l + 0xac) = 0xffff;
                *(undefined4 *)(l + 0xb0) = 0;
                *(undefined4 *)(l + 0xb4) = 0;
                *(undefined4 *)(l + 0xb8) = 0;
                *(undefined8 *)(l + 0xc0) = 0x3fe0000000000000;
                *(undefined4 *)(l + 0x30) = 0;
                *(undefined8 *)(l + 0x28) = 0;
                *(undefined8 *)(l + 8) = 0;
                l[0xe0] = (_func_void_LOG_CATEGORY_char_ptr_char_ptr_int_uint_char_ptr_varargs)
                          ((byte)l[0xe0] & 0xfb);
                *(undefined8 *)(l + 0xd8) = 0;
                l[0xe0] = (_func_void_LOG_CATEGORY_char_ptr_char_ptr_int_uint_char_ptr_varargs)
                          ((byte)l[0xe0] & 0xfe);
                *(undefined4 *)(l + 0x50) = 0x200;
                l[0xe0] = (_func_void_LOG_CATEGORY_char_ptr_char_ptr_int_uint_char_ptr_varargs)
                          ((byte)l[0xe0] & 0xf7);
                l[0xe0] = (_func_void_LOG_CATEGORY_char_ptr_char_ptr_int_uint_char_ptr_varargs)
                          ((byte)l[0xe0] & 0xfd);
                *(ON_NEW_ENDPOINT *)(l + 0x68) = on_new_endpoint;
                *(void **)(l + 0x70) = callback_context;
                *(undefined8 *)(l + 0x98) = 0;
                *(undefined8 *)(l + 0xa0) = 0;
                *(ON_IO_ERROR *)(l + 0x88) = on_io_error;
                *(void **)(l + 0x90) = on_io_error_context;
                *(ON_CONNECTION_STATE_CHANGED *)(l + 0x78) = on_connection_state_changed;
                *(void **)(l + 0x80) = on_connection_state_changed_context;
                iVar1 = tickcounter_get_current_ms
                                  (*(TICK_COUNTER_HANDLE *)(l + 0x48),(tickcounter_ms_t *)(l + 200))
                ;
                if (iVar1 == 0) {
                  *(undefined8 *)(l + 0xd0) = *(undefined8 *)(l + 200);
                  connection_set_state((CONNECTION_HANDLE)l,CONNECTION_STATE_START);
                }
                else {
                  p_Var2 = xlogging_get_log_function();
                  if (p_Var2 != (LOGGER_LOG)0x0) {
                    (*p_Var2)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                              ,"connection_create2",0x4f8,1,
                              "Could not retrieve time for last frame received time");
                  }
                  tickcounter_destroy(*(TICK_COUNTER_HANDLE *)(l + 0x48));
                  free(*(void **)(l + 0x40));
                  free(*(void **)(l + 0x38));
                  amqp_frame_codec_destroy(*(AMQP_FRAME_CODEC_HANDLE *)(l + 0x20));
                  frame_codec_destroy(*(FRAME_CODEC_HANDLE *)(l + 0x18));
                  free(l);
                  l = (LOGGER_LOG)0x0;
                }
              }
            }
          }
        }
      }
    }
  }
  return (CONNECTION_HANDLE)l;
}

Assistant:

CONNECTION_HANDLE connection_create2(XIO_HANDLE xio, const char* hostname, const char* container_id, ON_NEW_ENDPOINT on_new_endpoint, void* callback_context, ON_CONNECTION_STATE_CHANGED on_connection_state_changed, void* on_connection_state_changed_context, ON_IO_ERROR on_io_error, void* on_io_error_context)
{
    CONNECTION_HANDLE connection;

    if ((xio == NULL) ||
        (container_id == NULL))
    {
        /* Codes_S_R_S_CONNECTION_01_071: [If xio or container_id is NULL, connection_create shall return NULL.] */
        LogError("Bad arguments: xio = %p, container_id = %p",
            xio, container_id);
        connection = NULL;
    }
    else
    {
        connection = (CONNECTION_HANDLE)calloc(1, sizeof(CONNECTION_INSTANCE));
        /* Codes_S_R_S_CONNECTION_01_081: [If allocating the memory for the connection fails then connection_create shall return NULL.] */
        if (connection == NULL)
        {
            LogError("Cannot allocate memory for connection");
        }
        else
        {
            connection->io = xio;

            /* Codes_S_R_S_CONNECTION_01_082: [connection_create shall allocate a new frame_codec instance to be used for frame encoding/decoding.] */
            connection->frame_codec = frame_codec_create(frame_codec_error, connection);
            if (connection->frame_codec == NULL)
            {
                /* Codes_S_R_S_CONNECTION_01_083: [If frame_codec_create fails then connection_create shall return NULL.] */
                LogError("Cannot create frame_codec");
                free(connection);
                connection = NULL;
            }
            else
            {
                connection->amqp_frame_codec = amqp_frame_codec_create(connection->frame_codec, on_amqp_frame_received, on_empty_amqp_frame_received, amqp_frame_codec_error, connection);
                if (connection->amqp_frame_codec == NULL)
                {
                    /* Codes_S_R_S_CONNECTION_01_108: [If amqp_frame_codec_create fails, connection_create shall return NULL.] */
                    LogError("Cannot create amqp_frame_codec");
                    frame_codec_destroy(connection->frame_codec);
                    free(connection);
                    connection = NULL;
                }
                else
                {
                    if (hostname != NULL)
                    {
                        size_t hostname_length = strlen(hostname);
                        connection->host_name = (char*)malloc(hostname_length + 1);
                        if (connection->host_name == NULL)
                        {
                            /* Codes_S_R_S_CONNECTION_01_081: [If allocating the memory for the connection fails then connection_create shall return NULL.] */
                            LogError("Cannot allocate memory for host name");
                            amqp_frame_codec_destroy(connection->amqp_frame_codec);
                            frame_codec_destroy(connection->frame_codec);
                            free(connection);
                            connection = NULL;
                        }
                        else
                        {
                            (void)memcpy(connection->host_name, hostname, hostname_length + 1);
                        }
                    }
                    else
                    {
                        connection->host_name = NULL;
                    }

                    if (connection != NULL)
                    {
                        size_t container_id_length = strlen(container_id);
                        connection->container_id = (char*)malloc(container_id_length + 1);
                        if (connection->container_id == NULL)
                        {
                            /* Codes_S_R_S_CONNECTION_01_081: [If allocating the memory for the connection fails then connection_create shall return NULL.] */
                            LogError("Cannot allocate memory for container_id");
                            free(connection->host_name);
                            amqp_frame_codec_destroy(connection->amqp_frame_codec);
                            frame_codec_destroy(connection->frame_codec);
                            free(connection);
                            connection = NULL;
                        }
                        else
                        {
                            connection->tick_counter = tickcounter_create();
                            if (connection->tick_counter == NULL)
                            {
                                LogError("Cannot create tick counter");
                                free(connection->container_id);
                                free(connection->host_name);
                                amqp_frame_codec_destroy(connection->amqp_frame_codec);
                                frame_codec_destroy(connection->frame_codec);
                                free(connection);
                                connection = NULL;
                            }
                            else
                            {
                                (void)memcpy(connection->container_id, container_id, container_id_length + 1);

                                /* Codes_S_R_S_CONNECTION_01_173: [<field name="max-frame-size" type="uint" default="4294967295"/>] */
                                connection->max_frame_size = 4294967295u;
                                /* Codes: [<field name="channel-max" type="ushort" default="65535"/>] */
                                connection->channel_max = 65535;

                                /* Codes_S_R_S_CONNECTION_01_175: [<field name="idle-time-out" type="milliseconds"/>] */
                                /* Codes_S_R_S_CONNECTION_01_192: [A value of zero is the same as if it was not set (null).] */
                                connection->idle_timeout = 0;
                                connection->remote_idle_timeout = 0;
                                connection->remote_idle_timeout_send_frame_millisecond = 0;
                                connection->idle_timeout_empty_frame_send_ratio = 0.5;

                                connection->endpoint_count = 0;
                                connection->endpoints = NULL;
                                connection->header_bytes_received = 0;
                                connection->is_remote_frame_received = 0;
                                connection->properties = NULL;

                                connection->is_underlying_io_open = 0;
                                connection->remote_max_frame_size = 512;
                                connection->is_trace_on = 0;

                                /* Mark that settings have not yet been set by the user */
                                connection->idle_timeout_specified = 0;

                                connection->on_new_endpoint = on_new_endpoint;
                                connection->on_new_endpoint_callback_context = callback_context;

                                connection->on_connection_close_received_event_subscription.on_connection_close_received = NULL;
                                connection->on_connection_close_received_event_subscription.context = NULL;

                                connection->on_io_error = on_io_error;
                                connection->on_io_error_callback_context = on_io_error_context;
                                connection->on_connection_state_changed = on_connection_state_changed;
                                connection->on_connection_state_changed_callback_context = on_connection_state_changed_context;

                                if (tickcounter_get_current_ms(connection->tick_counter, &connection->last_frame_received_time) != 0)
                                {
                                    LogError("Could not retrieve time for last frame received time");
                                    tickcounter_destroy(connection->tick_counter);
                                    free(connection->container_id);
                                    free(connection->host_name);
                                    amqp_frame_codec_destroy(connection->amqp_frame_codec);
                                    frame_codec_destroy(connection->frame_codec);
                                    free(connection);
                                    connection = NULL;
                                }
                                else
                                {
                                    connection->last_frame_sent_time = connection->last_frame_received_time;

                                    /* Codes_S_R_S_CONNECTION_01_072: [When connection_create succeeds, the state of the connection shall be CONNECTION_STATE_START.] */
                                    connection_set_state(connection, CONNECTION_STATE_START);
                                }
                            }
                        }
                    }
                }
            }
        }
    }

    return connection;
}